

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

string * __thiscall
GYMPlayer::GetUTF8String_abi_cxx11_
          (string *__return_storage_ptr__,GYMPlayer *this,char *startPtr,char *endPtr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CPCONV *cpc;
  pointer pcVar2;
  UINT8 UVar3;
  char *convData;
  size_t convSize;
  char *local_38;
  size_t local_30;
  
  if (startPtr == endPtr) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cpc = this->_cpc1252;
    if (cpc != (CPCONV *)0x0) {
      local_30 = 0;
      local_38 = (char *)0x0;
      paVar1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      UVar3 = CPConv_StrConvert(cpc,&local_30,&local_38,(long)endPtr - (long)startPtr,startPtr);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 (ulong)local_38);
      free(local_38);
      if (-1 < (char)UVar3) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,startPtr,endPtr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GYMPlayer::GetUTF8String(const char* startPtr, const char* endPtr)
{
	if (startPtr == endPtr)
		return std::string();
	
	if (_cpc1252 != NULL)
	{
		size_t convSize = 0;
		char* convData = NULL;
		std::string result;
		UINT8 retVal;
		
		retVal = CPConv_StrConvert(_cpc1252, &convSize, &convData, endPtr - startPtr, startPtr);
		
		result.assign(convData, convData + convSize);
		free(convData);
		if (retVal < 0x80)
			return result;
	}
	// unable to convert - fallback using the original string
	return std::string(startPtr, endPtr);
}